

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O1

bool __thiscall binlog::SessionWriter::replaceChannel(SessionWriter *this,size_t minQueueCapacity)

{
  WriterProp *pWVar1;
  element_type *peVar2;
  __pthread_internal_list *p_Var3;
  pointer pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_> _Var5;
  char *pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  WriterProp *writerProp;
  WriterProp wp;
  __pthread_internal_list *local_90;
  undefined8 local_88;
  __pthread_internal_list local_80;
  undefined8 local_70;
  __native_type local_68;
  undefined8 local_40;
  __pthread_internal_list local_38;
  undefined8 local_28;
  
  pWVar1 = (WriterProp *)((this->_qw)._queue)->capacity;
  writerProp = (WriterProp *)(minQueueCapacity * 2);
  if ((WriterProp *)(minQueueCapacity * 2) < pWVar1) {
    writerProp = pWVar1;
  }
  peVar2 = (this->_channel).super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var3 = (__pthread_internal_list *)(peVar2->writerProp).id;
  pcVar4 = (peVar2->writerProp).name._M_dataplus._M_p;
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar4,pcVar4 + (peVar2->writerProp).name._M_string_length);
  local_70 = 0;
  if (local_90 == &local_80) {
    local_38.__next = local_80.__next;
    local_68.__data.__list.__next = &local_38;
  }
  else {
    local_68.__data.__list.__next = local_90;
  }
  local_38.__prev = (__pthread_internal_list *)CONCAT71(local_80.__prev._1_7_,local_80.__prev._0_1_)
  ;
  local_40 = local_88;
  local_88 = 0;
  local_80.__prev._0_1_ = 0;
  local_28 = 0;
  local_90 = &local_80;
  local_68.__data.__list.__prev = p_Var3;
  Session::createChannel((Session *)&local_68.__data,(size_t)this->_session,writerProp);
  uVar8 = local_68._8_8_;
  uVar7 = local_68.__align;
  local_68.__align = 0;
  local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->_channel).
            super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->_channel).super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar7;
  (this->_channel).super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  if (local_68.__data.__list.__next != &local_38) {
    operator_delete(local_68.__data.__list.__next,(ulong)((long)&(local_38.__prev)->__prev + 1));
  }
  _Var5.super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (((this->_channel).super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_queue)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>;
  pcVar6 = *(char **)((long)_Var5.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x28);
  (this->_qw)._queue =
       (Queue *)((long)_Var5.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x10);
  (this->_qw)._writePos = pcVar6;
  (this->_qw)._writeEnd = pcVar6;
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(local_80.__prev._1_7_,local_80.__prev._0_1_) + 1);
  }
  return true;
}

Assistant:

inline bool SessionWriter::replaceChannel(std::size_t minQueueCapacity) noexcept
{
  const std::size_t newCapacity = (std::max)(_qw.capacity(), 2 * minQueueCapacity);

  try
  {
    WriterProp wp{_channel->writerProp.id, _channel->writerProp.name, 0}; // avoid racing on the last field
    _channel = _session->createChannel(newCapacity, std::move(wp));
    _qw = detail::QueueWriter(_channel->queue());
  }
  catch (...)
  {
    // allocation and mutex lock in createChannel can throw,
    // but addEvent is more efficient if noexcept:
    // indicate failure by return value instead.
    return false;
  }

  return true;
}